

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  attributeDeclSAXFunc p_Var2;
  xmlChar *value;
  int iVar3;
  int iVar4;
  int iVar5;
  xmlType xVar6;
  xmlChar *pxVar7;
  xmlChar *fullattr;
  xmlParserInputPtr pxVar8;
  long lVar9;
  char *msg;
  xmlParserErrors error;
  xmlEnumerationPtr tree;
  xmlChar *defaultValue;
  xmlEnumerationPtr local_48;
  int local_3c;
  xmlChar *local_38;
  
  if (ctxt->mlType == XML_TYPE_SML) {
    pxVar8 = ctxt->input;
    pxVar7 = pxVar8->cur;
    if (*pxVar7 != '!') {
      return;
    }
    if (pxVar7[1] != 'A') {
      return;
    }
    if (pxVar7[2] != 'T') {
      return;
    }
    if (pxVar7[3] != 'T') {
      return;
    }
    if (pxVar7[4] != 'L') {
      return;
    }
    if (pxVar7[5] != 'I') {
      return;
    }
    if (pxVar7[6] != 'S') {
      return;
    }
    if (pxVar7[7] != 'T') {
      return;
    }
    lVar9 = 8;
    iVar3 = 8;
  }
  else {
    if (ctxt->mlType != XML_TYPE_XML) {
      return;
    }
    pxVar8 = ctxt->input;
    pxVar7 = pxVar8->cur;
    if (*pxVar7 != '<') {
      return;
    }
    if (pxVar7[1] != '!') {
      return;
    }
    if (pxVar7[2] != 'A') {
      return;
    }
    if (pxVar7[3] != 'T') {
      return;
    }
    if (pxVar7[4] != 'T') {
      return;
    }
    if (pxVar7[5] != 'L') {
      return;
    }
    if (pxVar7[6] != 'I') {
      return;
    }
    if (pxVar7[7] != 'S') {
      return;
    }
    if (pxVar7[8] != 'T') {
      return;
    }
    lVar9 = 9;
    iVar3 = 9;
  }
  local_3c = pxVar8->id;
  pxVar8->cur = pxVar7 + lVar9;
  pxVar8->col = pxVar8->col + iVar3;
  if (pxVar7[lVar9] == '\0') {
    xmlParserInputGrow(pxVar8,0xfa);
  }
  iVar3 = xmlSkipBlankChars(ctxt);
  if (iVar3 == 0) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after \'<!ATTLIST\'\n");
  }
  pxVar7 = xmlParseName(ctxt);
  if (pxVar7 == (xmlChar *)0x0) {
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"ATTLIST: no name for Element\n");
    return;
  }
  xmlSkipBlankChars(ctxt);
LAB_00161696:
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  xVar6 = ctxt->mlType;
  if (xVar6 == XML_TYPE_SML) {
    xVar1 = *ctxt->input->cur;
    if ((xVar1 == '\n') || (xVar1 == ';')) goto LAB_001619d8;
  }
  else if ((xVar6 == XML_TYPE_XML) && (*ctxt->input->cur == '>')) goto LAB_001619c9;
  if (ctxt->instate == XML_PARSER_EOF) goto LAB_001619bf;
  local_38 = (xmlChar *)0x0;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  local_48 = (xmlEnumerationPtr)0x0;
  fullattr = xmlParseName(ctxt);
  if (fullattr == (xmlChar *)0x0) {
    msg = "ATTLIST: no name for Attribute\n";
    error = XML_ERR_NAME_REQUIRED;
LAB_00161968:
    xmlFatalErrMsg(ctxt,error,msg);
    goto LAB_001619b9;
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  iVar3 = xmlSkipBlankChars(ctxt);
  if (iVar3 == 0) {
    msg = "Space required after the attribute name\n";
    error = XML_ERR_SPACE_REQUIRED;
    goto LAB_00161968;
  }
  iVar3 = xmlParseAttributeType(ctxt,&local_48);
  if (iVar3 < 1) goto LAB_001619b9;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  iVar4 = xmlSkipBlankChars(ctxt);
  if (iVar4 == 0) {
    xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after the attribute type\n");
    goto LAB_001619aa;
  }
  iVar4 = xmlParseDefaultDecl(ctxt,&local_38);
  value = local_38;
  if (local_38 != (xmlChar *)0x0 && iVar3 != 1) {
    xmlAttrNormalizeSpace(local_38,local_38);
  }
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (ctxt->mlType == XML_TYPE_SML) {
    xVar1 = *ctxt->input->cur;
    if ((xVar1 != '\n') && (xVar1 != ';')) goto LAB_00161864;
  }
  else if ((ctxt->mlType != XML_TYPE_XML) || (*ctxt->input->cur != '>')) {
LAB_00161864:
    iVar5 = xmlSkipBlankChars(ctxt);
    if (iVar5 == 0) goto LAB_00161985;
  }
  if (((ctxt->sax == (_xmlSAXHandler *)0x0) || (ctxt->disableSAX != 0)) ||
     (p_Var2 = ctxt->sax->attributeDecl, p_Var2 == (attributeDeclSAXFunc)0x0)) {
    if (local_48 != (xmlEnumerationPtr)0x0) {
      xmlFreeEnumeration(local_48);
    }
  }
  else {
    (*p_Var2)(ctxt->userData,pxVar7,fullattr,iVar3,iVar4,value,local_48);
  }
  iVar5 = ctxt->sax2;
  if (iVar4 - 4U < 0xfffffffe && (iVar5 != 0 && value != (xmlChar *)0x0)) {
    xmlAddDefAttrs(ctxt,pxVar7,fullattr,value);
    iVar5 = ctxt->sax2;
  }
  if (iVar5 != 0) {
    xmlAddSpecialAttr(ctxt,pxVar7,fullattr,iVar3);
  }
  if (value != (xmlChar *)0x0) {
    (*xmlFree)(value);
  }
  goto LAB_00161696;
LAB_00161985:
  xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"Space required after the attribute default value\n");
  if (value != (xmlChar *)0x0) {
    (*xmlFree)(value);
  }
LAB_001619aa:
  if (local_48 != (xmlEnumerationPtr)0x0) {
    xmlFreeEnumeration(local_48);
  }
LAB_001619b9:
  xVar6 = ctxt->mlType;
LAB_001619bf:
  if (xVar6 == XML_TYPE_SML) {
LAB_001619d8:
    pxVar8 = ctxt->input;
    if ((*pxVar8->cur == ';') || (*pxVar8->cur == '\n')) {
LAB_001619ed:
      if (local_3c != pxVar8->id) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "Attribute list declaration doesn\'t start and stop in the same entity\n");
      }
      xmlNextChar(ctxt);
      return;
    }
  }
  else if (xVar6 == XML_TYPE_XML) {
LAB_001619c9:
    pxVar8 = ctxt->input;
    if (*pxVar8->cur == '>') goto LAB_001619ed;
  }
  return;
}

Assistant:

void
xmlParseAttributeListDecl(xmlParserCtxtPtr ctxt) {
    const xmlChar *elemName;
    const xmlChar *attrName;
    xmlEnumerationPtr tree;

    DEBUG_ENTER(("xmlParseAttributeListDecl(%s);\n", dbgCtxt(ctxt)));

    if (CMP9_MLI(CUR_PTR, '<', '!', 'A', 'T', 'T', 'L', 'I', 'S', 'T')) {
	int inputid = ctxt->input->id;

	SKIP_MLI(9);
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		                 "Space required after '<!ATTLIST'\n");
	}
        elemName = xmlParseName(ctxt);
	if (elemName == NULL) {
	    xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			   "ATTLIST: no name for Element\n");
	    RETURN();
	}
	SKIP_BLANKS;
	GROW;
	while ((!RAW_IS_GT_MLI) && (ctxt->instate != XML_PARSER_EOF)) {
	    int type;
	    int def;
	    xmlChar *defaultValue = NULL;

	    GROW;
            tree = NULL;
	    attrName = xmlParseName(ctxt);
	    if (attrName == NULL) {
		xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
			       "ATTLIST: no name for Attribute\n");
		break;
	    }
	    GROW;
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
		        "Space required after the attribute name\n");
		break;
	    }

	    type = xmlParseAttributeType(ctxt, &tree);
	    if (type <= 0) {
	        break;
	    }

	    GROW;
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			       "Space required after the attribute type\n");
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
		break;
	    }

	    def = xmlParseDefaultDecl(ctxt, &defaultValue);
	    if (def <= 0) {
                if (defaultValue != NULL)
		    xmlFree(defaultValue);
	        if (tree != NULL)
		    xmlFreeEnumeration(tree);
	        break;
	    }
	    if ((type != XML_ATTRIBUTE_CDATA) && (defaultValue != NULL))
	        xmlAttrNormalizeSpace(defaultValue, defaultValue);

	    GROW;
            if (!RAW_IS_GT_MLI) { /* RAW != '>' */
		if (SKIP_BLANKS == 0) {
		    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			"Space required after the attribute default value\n");
		    if (defaultValue != NULL)
			xmlFree(defaultValue);
		    if (tree != NULL)
			xmlFreeEnumeration(tree);
		    break;
		}
	    }
	    if ((ctxt->sax != NULL) && (!ctxt->disableSAX) &&
		(ctxt->sax->attributeDecl != NULL))
		ctxt->sax->attributeDecl(ctxt->userData, elemName, attrName,
	                        type, def, defaultValue, tree);
	    else if (tree != NULL)
		xmlFreeEnumeration(tree);

	    if ((ctxt->sax2) && (defaultValue != NULL) &&
	        (def != XML_ATTRIBUTE_IMPLIED) &&
		(def != XML_ATTRIBUTE_REQUIRED)) {
		xmlAddDefAttrs(ctxt, elemName, attrName, defaultValue);
	    }
	    if (ctxt->sax2) {
		xmlAddSpecialAttr(ctxt, elemName, attrName, type);
	    }
	    if (defaultValue != NULL)
	        xmlFree(defaultValue);
	    GROW;
	}
	if (RAW_IS_GT_MLI) { /* RAW == '>' */
	    if (inputid != ctxt->input->id) {
		xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "Attribute list declaration doesn't start and"
                               " stop in the same entity\n");
	    }
	    NEXT;
	}
    }
    RETURN();
}